

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

mk_plugin * mk_plugin_load(int type,char *shortname,void *data,mk_server *server)

{
  mk_list *pmVar1;
  int iVar2;
  _func_int_int *handler_00;
  _func_int_mk_http_session_ptr_mk_http_request_ptr *p_Var3;
  undefined8 *puVar4;
  void *pvVar5;
  mk_plugin_stage *st;
  mk_list *__mptr;
  mk_plugin_stage *stage;
  mk_plugin *plugin;
  mk_plugin *tmp;
  mk_list *head;
  void *handler;
  char symbol [64];
  char *path;
  mk_server *server_local;
  void *data_local;
  char *shortname_local;
  mk_plugin *pmStack_10;
  int type_local;
  
  stage = (mk_plugin_stage *)0x0;
  if (type == 1) {
    symbol._56_8_ = data;
    handler_00 = (_func_int_int *)mk_plugin_load_dynamic((char *)data);
    if (handler_00 == (_func_int_int *)0x0) {
      return (mk_plugin *)0x0;
    }
    snprintf((char *)&handler,0x3f,"mk_plugin_%s",shortname);
    stage = (mk_plugin_stage *)mk_plugin_load_symbol(handler_00,(char *)&handler);
    if (stage == (mk_plugin_stage *)0x0) {
      mk_print(0x1002,"Plugin \'%s\' is not registering properly",symbol._56_8_);
      dlclose(handler_00);
      return (mk_plugin *)0x0;
    }
    for (tmp = (mk_plugin *)(server->plugins).next; tmp != (mk_plugin *)&server->plugins;
        tmp = (mk_plugin *)tmp->shortname) {
      if ((tmp->hooks == 0) &&
         (iVar2 = strcmp((char *)tmp[-1].master_init,(char *)stage->stage30), iVar2 == 0)) {
        mk_print(0x1002,"Plugin \'%s\' have been built-in.",tmp[-1].exit_plugin);
        dlclose(handler_00);
        return (mk_plugin *)0x0;
      }
    }
    *(undefined4 *)&stage[1].plugin = 1;
    stage[1].stage10 = handler_00;
    p_Var3 = (_func_int_mk_http_session_ptr_mk_http_request_ptr *)
             mk_string_dup((char *)symbol._56_8_);
    stage[1].stage20 = p_Var3;
  }
  else if (type == 0) {
    *(undefined4 *)((long)data + 0x98) = 0;
    stage = (mk_plugin_stage *)data;
  }
  if (stage == (mk_plugin_stage *)0x0) {
    pmStack_10 = (mk_plugin *)0x0;
  }
  else if ((((stage->stage20 == (_func_int_mk_http_session_ptr_mk_http_request_ptr *)0x0) ||
            (stage->stage30 ==
             (_func_int_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr *)0x0)
            ) || (stage->stage30_thread ==
                  (_func_void_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr
                   *)0x0)) ||
          ((stage->stage50 == (_func_int_int *)0x0 || (stage->plugin == (mk_plugin *)0x0)))) {
    mk_print(0x1002,"Plugin \'%s\' is not registering all fields properly",shortname);
    pmStack_10 = (mk_plugin *)0x0;
  }
  else {
    if ((((ulong)stage->stage30_hangup & 0x80) != 0) &&
       ((stage->_parent_head).prev == (mk_list *)0x0)) {
      mk_print(0x1003,"Bug found in %s() at %s:%d","mk_plugin_load",
               "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_plugin.c"
               ,0xd1);
      abort();
    }
    mk_list_init((mk_list *)&stage[1].stage40);
    if (((ulong)stage->stage30_hangup & 0x100) != 0) {
      pmVar1 = (stage->_parent_head).next;
      if (pmVar1->prev != (mk_list *)0x0) {
        puVar4 = (undefined8 *)mk_mem_alloc(0x60);
        *puVar4 = pmVar1->prev;
        puVar4[7] = stage;
        mk_list_add((mk_list *)(puVar4 + 8),&server->stage10_handler);
        mk_list_add((mk_list *)(puVar4 + 10),(mk_list *)&stage[1].stage40);
      }
      if (pmVar1->next != (mk_list *)0x0) {
        pvVar5 = mk_mem_alloc(0x60);
        *(mk_list **)((long)pvVar5 + 8) = pmVar1->next;
        *(mk_plugin_stage **)((long)pvVar5 + 0x38) = stage;
        mk_list_add((mk_list *)((long)pvVar5 + 0x40),&server->stage20_handler);
        mk_list_add((mk_list *)((long)pvVar5 + 0x50),(mk_list *)&stage[1].stage40);
      }
      if (pmVar1[1].prev != (mk_list *)0x0) {
        pvVar5 = mk_mem_alloc(0x60);
        *(mk_list **)((long)pvVar5 + 0x10) = pmVar1[1].prev;
        *(mk_plugin_stage **)((long)pvVar5 + 0x38) = stage;
        mk_list_add((mk_list *)((long)pvVar5 + 0x40),&server->stage30_handler);
        mk_list_add((mk_list *)((long)pvVar5 + 0x50),(mk_list *)&stage[1].stage40);
      }
      if (pmVar1[2].next != (mk_list *)0x0) {
        pvVar5 = mk_mem_alloc(0x60);
        *(mk_list **)((long)pvVar5 + 0x28) = pmVar1[2].next;
        *(mk_plugin_stage **)((long)pvVar5 + 0x38) = stage;
        mk_list_add((mk_list *)((long)pvVar5 + 0x40),&server->stage40_handler);
        mk_list_add((mk_list *)((long)pvVar5 + 0x50),(mk_list *)&stage[1].stage40);
      }
      if (pmVar1[3].prev != (mk_list *)0x0) {
        pvVar5 = mk_mem_alloc(0x60);
        *(mk_list **)((long)pvVar5 + 0x30) = pmVar1[3].prev;
        *(mk_plugin_stage **)((long)pvVar5 + 0x38) = stage;
        mk_list_add((mk_list *)((long)pvVar5 + 0x40),&server->stage50_handler);
        mk_list_add((mk_list *)((long)pvVar5 + 0x50),(mk_list *)&stage[1].stage40);
      }
    }
    if (type == 1) {
      mk_list_add((mk_list *)&stage[1].stage30_thread,&server->plugins);
    }
    pmStack_10 = (mk_plugin *)stage;
  }
  return pmStack_10;
}

Assistant:

struct mk_plugin *mk_plugin_load(int type, const char *shortname,
                                 void *data, struct mk_server *server)
{
    char *path;
    char symbol[64];
    void *handler;
    struct mk_list *head;
    struct mk_plugin *tmp;
    struct mk_plugin *plugin = NULL;
    struct mk_plugin_stage *stage;

    /* Set main struct name to reference */
    if (type == MK_PLUGIN_DYNAMIC) {
        path = (char *) data;
        handler = mk_plugin_load_dynamic(path);
        if (!handler) {
            return NULL;
        }

        snprintf(symbol, sizeof(symbol) - 1, "mk_plugin_%s", shortname);
        plugin  = mk_plugin_load_symbol(handler, symbol);
        if (!plugin) {
            mk_warn("Plugin '%s' is not registering properly", path);
#ifdef _WIN32
            FreeLibrary((HMODULE)handler);
#else
            dlclose(handler);
#endif
            return NULL;
        }

        /* Make sure this is not loaded twice (ref #218) */
        mk_list_foreach(head, &server->plugins) {
            tmp = mk_list_entry(head, struct mk_plugin, _head);
            if (tmp->load_type == MK_PLUGIN_STATIC &&
                strcmp(tmp->name, plugin->name) == 0){
                mk_warn("Plugin '%s' have been built-in.",
                        tmp->shortname);
#ifdef _WIN32
                FreeLibrary((HMODULE)handler);
#else
                dlclose(handler);
#endif
                return NULL;
            }
        }

        plugin->load_type = MK_PLUGIN_DYNAMIC;
        plugin->handler   = handler;
        plugin->path      = mk_string_dup(path);
    }
    else if (type == MK_PLUGIN_STATIC) {
        plugin = (struct mk_plugin *) data;
        plugin->load_type = MK_PLUGIN_STATIC;
    }

    if (!plugin) {
        return NULL;
    }

    /* Validate all callbacks are set */
    if (!plugin->shortname || !plugin->name || !plugin->version ||
        !plugin->init_plugin || !plugin->exit_plugin) {
        mk_warn("Plugin '%s' is not registering all fields properly",
                shortname);
        return NULL;
    }

    if (plugin->hooks & MK_PLUGIN_NETWORK_LAYER) {
        mk_bug(!plugin->network);
    }

    mk_list_init(&plugin->stage_list);
    if (plugin->hooks & MK_PLUGIN_STAGE) {
        struct mk_plugin_stage *st;

        stage = plugin->stage;
        if (stage->stage10) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage10 = stage->stage10;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage10_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage20) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage20 = stage->stage20;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage20_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage30) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage30 = stage->stage30;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage30_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage40) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage40 = stage->stage40;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage40_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage50) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage50 = stage->stage50;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage50_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
    }

    if (type == MK_PLUGIN_DYNAMIC) {
        /* Add Plugin to the end of the list */
        mk_list_add(&plugin->_head, &server->plugins);
    }

    return plugin;
}